

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QByteArray * QString::toUtf8_helper(QByteArray *__return_storage_ptr__,QString *str)

{
  QStringView str_00;
  
  str_00.m_data = (str->d).ptr;
  str_00.m_size = (str->d).size;
  qt_convert_to_utf8(__return_storage_ptr__,str_00);
  return __return_storage_ptr__;
}

Assistant:

QByteArray QString::toUtf8_helper(const QString &str)
{
    return qt_convert_to_utf8(str);
}